

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O0

void __thiscall Js::DebugManager::ValidateDebugAPICall(DebugManager *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptEntryExitRecord *pSVar4;
  void **ppvVar5;
  undefined4 *puVar6;
  void *topJsFrameAddr;
  JavascriptFunction *local_c0;
  JavascriptFunction *javascriptFunction;
  JavascriptStackWalker walker;
  DebugManager *this_local;
  
  walker.currentFrame.stackCheckCodeHeight = (size_t)this;
  pSVar4 = ThreadContext::GetScriptEntryExit(this->pThreadContext);
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)&javascriptFunction,pSVar4->scriptContext,true,(PVOID)0x0,
             false);
  local_c0 = (JavascriptFunction *)0x0;
  BVar3 = JavascriptStackWalker::GetCaller
                    ((JavascriptStackWalker *)&javascriptFunction,&local_c0,true);
  if ((BVar3 != 0) && (local_c0 != (JavascriptFunction *)0x0)) {
    ppvVar5 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)&javascriptFunction);
    if (this->dispatchHaltFrameAddress == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                  ,0xcb,"(this->dispatchHaltFrameAddress != nullptr)",
                                  "this->dispatchHaltFrameAddress != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (ppvVar5 < this->dispatchHaltFrameAddress) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                  ,0xcf,"(false)",
                                  "There are JavaScript frames between current API and dispatch halt"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)&javascriptFunction);
  return;
}

Assistant:

void DebugManager::ValidateDebugAPICall()
    {
        Js::JavascriptStackWalker walker(this->pThreadContext->GetScriptEntryExit()->scriptContext);
        Js::JavascriptFunction* javascriptFunction = nullptr;
        if (walker.GetCaller(&javascriptFunction))
        {
            if (javascriptFunction != nullptr)
            {
                void *topJsFrameAddr = (void *)walker.GetCurrentArgv();
                Assert(this->dispatchHaltFrameAddress != nullptr);
                if (topJsFrameAddr < this->dispatchHaltFrameAddress)
                {
                    // we found the script frame after the break mode.
                    AssertMsg(false, "There are JavaScript frames between current API and dispatch halt");
                }
            }
        }
    }